

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_sinks.h
# Opt level: O0

filename_t *
spdlog::sinks::rotating_file_sink<std::mutex>::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,size_t index)

{
  BasicCStringRef<char> local_300;
  BasicCStringRef<char> local_2f8;
  undefined1 local_2f0 [80];
  undefined1 local_2a0 [8];
  filename_t ext;
  filename_t basename;
  allocator<char> local_249;
  undefined1 local_248 [8];
  type w;
  size_t index_local;
  filename_t *filename_local;
  
  w.buffer_._528_8_ = index;
  std::allocator<char>::allocator();
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)local_248,&local_249);
  std::allocator<char>::~allocator(&local_249);
  if (w.buffer_._528_8_ == 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_300,"{}");
    fmt::BasicWriter<char>::write<std::__cxx11::string>
              ((BasicWriter<char> *)local_248,local_300,filename);
  }
  else {
    std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_2a0);
    details::file_helper::split_by_extenstion
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_2f0 + 0x10),filename);
    std::tie<std::__cxx11::string,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&ext.field_2 + 8));
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)local_2f0,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_2f0 + 0x10));
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(local_2f0 + 0x10));
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_2f8,"{}.{}{}");
    fmt::BasicWriter<char>::write<std::__cxx11::string,unsigned_long,std::__cxx11::string>
              ((BasicWriter<char> *)local_248,local_2f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&ext.field_2 + 8),(unsigned_long *)(w.buffer_.data_ + 0x1f0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
  }
  fmt::BasicWriter<char>::str_abi_cxx11_(__return_storage_ptr__,(BasicWriter<char> *)local_248);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)local_248);
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, std::size_t index)
    {
        typename std::conditional<std::is_same<filename_t::value_type, char>::value, fmt::MemoryWriter, fmt::WMemoryWriter>::type w;
        if (index != 0u)
        {
            filename_t basename, ext;
            std::tie(basename, ext) = details::file_helper::split_by_extenstion(filename);
            w.write(SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
        }
        else
        {
            w.write(SPDLOG_FILENAME_T("{}"), filename);
        }
        return w.str();
    }